

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UnicodeString *
icu_63::TimeZone::getEquivalentID
          (UnicodeString *__return_storage_ptr__,UnicodeString *id,int32_t index)

{
  UResourceBundle *resB;
  int32_t *piVar1;
  UResourceBundle *resB_00;
  int32_t indexS;
  UErrorCode ec;
  int32_t size;
  UResourceBundle r;
  UResourceBundle res;
  UErrorCode local_1d8;
  int32_t local_1d4;
  ConstChar16Ptr local_1d0;
  UChar *local_1c8;
  UResourceBundle local_1b8;
  UResourceBundle local_f0;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_1d8 = U_ZERO_ERROR;
  ures_initStackObject_63(&local_f0);
  resB = openOlsonResource(id,&local_f0,&local_1d8);
  indexS = -1;
  if (local_1d8 < U_ILLEGAL_ARGUMENT_ERROR) {
    ures_initStackObject_63(&local_1b8);
    ures_getByKey_63(&local_f0,"links",&local_1b8,&local_1d8);
    piVar1 = ures_getIntVector_63(&local_1b8,&local_1d4,&local_1d8);
    indexS = -1;
    if (((-1 < index) && (local_1d8 < U_ILLEGAL_ARGUMENT_ERROR)) && (index < local_1d4)) {
      indexS = piVar1[(uint)index];
    }
    ures_close_63(&local_1b8);
  }
  ures_close_63(&local_f0);
  if (-1 < indexS) {
    resB_00 = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,&local_1d8);
    if (local_1d8 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_1d4 = 0;
      local_1d0.p_ = ures_getStringByIndex_63(resB_00,indexS,&local_1d4,&local_1d8);
      UnicodeString::UnicodeString((UnicodeString *)&local_1b8,'\x01',&local_1d0,local_1d4);
      UnicodeString::fastCopyFrom(__return_storage_ptr__,(UnicodeString *)&local_1b8);
      UnicodeString::~UnicodeString((UnicodeString *)&local_1b8);
      local_1c8 = local_1d0.p_;
    }
    ures_close_63(resB_00);
  }
  ures_close_63(resB);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString U_EXPORT2
TimeZone::getEquivalentID(const UnicodeString& id, int32_t index) {
    U_DEBUG_TZ_MSG(("gEI(%d)\n", index));
    UnicodeString result;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle res;
    ures_initStackObject(&res);
    UResourceBundle *top = openOlsonResource(id, res, ec);
    int32_t zone = -1;
    if (U_SUCCESS(ec)) {
        UResourceBundle r;
        ures_initStackObject(&r);
        int32_t size;
        ures_getByKey(&res, kLINKS, &r, &ec);
        const int32_t* v = ures_getIntVector(&r, &size, &ec);
        if (U_SUCCESS(ec)) {
            if (index >= 0 && index < size) {
                zone = v[index];
            }
        }
        ures_close(&r);
    }
    ures_close(&res);
    if (zone >= 0) {
        UResourceBundle *ares = ures_getByKey(top, kNAMES, NULL, &ec); // dereference Zones section
        if (U_SUCCESS(ec)) {
            int32_t idLen = 0;
            const UChar* id2 = ures_getStringByIndex(ares, zone, &idLen, &ec);
            result.fastCopyFrom(UnicodeString(TRUE, id2, idLen));
            U_DEBUG_TZ_MSG(("gei(%d) -> %d, len%d, %s\n", index, zone, result.length(), u_errorName(ec)));
        }
        ures_close(ares);
    }
    ures_close(top);
#if defined(U_DEBUG_TZ)
    if(result.length() ==0) {
      U_DEBUG_TZ_MSG(("equiv [__, #%d] -> 0 (%s)\n", index, u_errorName(ec)));
    }
#endif
    return result;
}